

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

int __thiscall
TPZMatrix<std::complex<float>_>::Decompose_Cholesky
          (TPZMatrix<std::complex<float>_> *this,list<long,_std::allocator<long>_> *singular)

{
  double dVar1;
  long lVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  complex<float> a;
  int64_t k;
  long lVar6;
  long lVar7;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  float extraout_XMM0_Da_04;
  float extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Da_06;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  float extraout_XMM0_Db_04;
  float extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  long local_80;
  complex<float> local_78;
  complex<float> tmp;
  complex<float> local_68;
  complex<float> local_60;
  float local_58;
  float fStack_54;
  long local_40;
  list<long,_std::allocator<long>_> *local_38;
  
  cVar3 = (this->super_TPZBaseMatrix).fDecomposed;
  local_38 = singular;
  if ((cVar3 != '\0') && (cVar3 != '\x03')) {
    Error("Decompose_Cholesky <Matrix already Decomposed>",(char *)0x0);
    cVar3 = (this->super_TPZBaseMatrix).fDecomposed;
  }
  if (cVar3 == '\0') {
    if ((this->super_TPZBaseMatrix).fRow != (this->super_TPZBaseMatrix).fCol) {
      Error("Decompose_Cholesky <Matrix must be square>",(char *)0x0);
    }
    iVar5 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
    local_40 = CONCAT44(extraout_var,iVar5);
    for (local_80 = 0; local_80 < local_40; local_80 = local_80 + 1) {
      for (lVar6 = 0; lVar7 = local_80, lVar6 < local_80; lVar6 = lVar6 + 1) {
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  (this,local_80,local_80);
        local_58 = extraout_XMM0_Da;
        fStack_54 = extraout_XMM0_Db;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,local_80,lVar6);
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,local_80,lVar6);
        std::operator*(&local_78,&local_60);
        tmp._M_value = CONCAT44(fStack_54 - extraout_XMM0_Db_00,local_58 - extraout_XMM0_Da_00);
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (this,lVar7,lVar7,&tmp);
      }
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,local_80,local_80)
      ;
      dVar1 = fabs((double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01));
      local_58 = SUB84(dVar1,0);
      dVar1 = fabs(3.60985931757712e-315);
      if (local_58 <= SUB84(dVar1,0)) {
        std::__cxx11::list<long,_std::allocator<long>_>::push_back(local_38,&local_80);
        tmp._M_value = 0x3f800000;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (this,local_80,local_80,&tmp);
      }
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,local_80);
      local_78._M_value = CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02);
      std::sqrt<float>(&local_78);
      tmp._M_value = CONCAT44(extraout_XMM0_Db_03,extraout_XMM0_Da_03);
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                (this,local_80,local_80,&tmp);
      lVar6 = local_80;
      while (lVar6 = lVar6 + 1, lVar6 < local_40) {
        for (lVar7 = 0; lVar2 = local_80, lVar7 < local_80; lVar7 = lVar7 + 1) {
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    (this,local_80,lVar6);
          local_58 = extraout_XMM0_Da_04;
          fStack_54 = extraout_XMM0_Db_04;
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    (this,local_80,lVar7);
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar7,lVar6);
          std::operator*(&local_60,&local_68);
          local_78._M_value =
               CONCAT44(fStack_54 - extraout_XMM0_Db_05,local_58 - extraout_XMM0_Da_05);
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (this,lVar2,lVar6,&local_78);
        }
        a._M_value = (_ComplexT)this;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  (this,local_80,local_80);
        bVar4 = IsZero(a);
        if (bVar4) {
          Error("Decompose_Cholesky <Zero on diagonal>",(char *)0x0);
        }
        lVar7 = local_80;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,local_80,lVar6);
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,local_80);
        std::operator/(&local_60,&local_68);
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (this,lVar7,lVar6,&local_78);
        lVar7 = local_80;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,local_80,lVar6);
        local_78._M_value = CONCAT44(extraout_XMM0_Db_06,extraout_XMM0_Da_06);
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (this,lVar6,lVar7,&local_78);
      }
    }
    (this->super_TPZBaseMatrix).fDecomposed = '\x03';
  }
  return 3;
}

Assistant:

int TPZMatrix<TVar>::Decompose_Cholesky(std::list<int64_t> &singular) {
	if (  fDecomposed && fDecomposed != ECholesky) Error( "Decompose_Cholesky <Matrix already Decomposed>" );
	if (  fDecomposed ) return ECholesky;
	if ( Rows()!=Cols() ) Error( "Decompose_Cholesky <Matrix must be square>" );
	//return 0;
	
	int64_t dim=Dim();
	for (int64_t i=0 ; i<dim; i++) {
		for(int64_t k=0; k<i; k++) {             //elementos da diagonal
			PutVal( i,i,GetVal(i,i)-GetVal(i,k)*GetVal(i,k) );
		}
		if((fabs(GetVal(i,i))) <= fabs((TVar)1.e-12))
		{
			singular.push_back(i);
			PutVal(i,i,1.);
		}
		TVar tmp = sqrt(GetVal(i,i));
        PutVal( i,i,tmp );
        for (int64_t j=i+1;j<dim; j++) {           //elementos fora da diagonal
            for(int64_t k=0; k<i; k++) {
                PutVal( i,j,GetVal(i,j)-GetVal(i,k)*GetVal(k,j) );
            }
            TVar tmp2 = GetVal(i,i);
            if ( IsZero(tmp2) ) {
				Error( "Decompose_Cholesky <Zero on diagonal>" );
            }
            PutVal(i,j,GetVal(i,j)/GetVal(i,i) );
            PutVal(j,i,GetVal(i,j));
			
        }
    }
	fDecomposed = ECholesky;
	return ECholesky;
}